

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::
FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
          (ExtensionSet *this,int wire_type,int field_number,
          GeneratedExtensionFinder *extension_finder,ExtensionInfo *extension,
          bool *was_packed_on_wire)

{
  bool bVar1;
  WireType type;
  LogMessage *pLVar2;
  WireType expected_wire_type;
  FieldType real_type;
  char *local_58;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  bool *local_38;
  bool *was_packed_on_wire_local;
  ExtensionInfo *extension_local;
  GeneratedExtensionFinder *extension_finder_local;
  int field_number_local;
  int wire_type_local;
  ExtensionSet *this_local;
  
  local_38 = was_packed_on_wire;
  was_packed_on_wire_local = (bool *)extension;
  extension_local = (ExtensionInfo *)extension_finder;
  extension_finder_local._0_4_ = field_number;
  extension_finder_local._4_4_ = wire_type;
  _field_number_local = this;
  bVar1 = GeneratedExtensionFinder::Find(extension_finder,field_number,extension);
  if (bVar1) {
    bVar1 = false;
    if (was_packed_on_wire_local[0xc] != false) {
      bVar1 = was_packed_on_wire_local[0xc] < 0x13;
    }
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&real_type,
                 "extension->type > 0 && extension->type <= WireFormatLite::MAX_FIELD_TYPE");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.h"
                 ,0x3af,_real_type,local_58);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
    }
    type = WireFormatLite::WireTypeForFieldType((uint)was_packed_on_wire_local[0xc]);
    *local_38 = false;
    if ((((was_packed_on_wire_local[0xd] & 1U) == 0) ||
        (extension_finder_local._4_4_ != WIRETYPE_LENGTH_DELIMITED)) ||
       (bVar1 = is_packable(type), !bVar1)) {
      this_local._7_1_ = type == extension_finder_local._4_4_;
    }
    else {
      *local_38 = true;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FindExtensionInfoFromFieldNumber(int wire_type, int field_number,
                                        ExtensionFinder* extension_finder,
                                        ExtensionInfo* extension,
                                        bool* was_packed_on_wire) const {
    if (!extension_finder->Find(field_number, extension)) {
      return false;
    }

    ABSL_DCHECK(extension->type > 0 &&
                extension->type <= WireFormatLite::MAX_FIELD_TYPE);
    auto real_type = static_cast<WireFormatLite::FieldType>(extension->type);

    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type);

    // Check if this is a packed field.
    *was_packed_on_wire = false;
    if (extension->is_repeated &&
        wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
        is_packable(expected_wire_type)) {
      *was_packed_on_wire = true;
      return true;
    }
    // Otherwise the wire type must match.
    return expected_wire_type == wire_type;
  }